

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_error_string(int err)

{
  char *pcStack_10;
  int err_local;
  
  switch(err) {
  case 0:
    pcStack_10 = "ok";
    break;
  case 1:
    pcStack_10 = "eof";
    break;
  case 2:
    pcStack_10 = "deep nesting";
    break;
  case 3:
    pcStack_10 = "trailing comma";
    break;
  case 4:
    pcStack_10 = "expected colon";
    break;
  case 5:
    pcStack_10 = "unexpected character";
    break;
  case 6:
    pcStack_10 = "invalid numeric";
    break;
  case 7:
    pcStack_10 = "overflow";
    break;
  case 8:
    pcStack_10 = "underflow";
    break;
  case 9:
    pcStack_10 = "unbalanced array";
    break;
  case 10:
    pcStack_10 = "unbalanced object";
    break;
  case 0xb:
    pcStack_10 = "precision loss";
    break;
  case 0xc:
    pcStack_10 = "float unexpected";
    break;
  case 0xd:
    pcStack_10 = "unknown symbol";
    break;
  case 0xe:
    pcStack_10 = "unquoted list of symbols";
    break;
  case 0xf:
    pcStack_10 = "unknown union type";
    break;
  case 0x10:
    pcStack_10 = "expected string";
    break;
  case 0x11:
    pcStack_10 = "invalid character";
    break;
  case 0x12:
    pcStack_10 = "invalid escape";
    break;
  case 0x13:
    pcStack_10 = "invalid type";
    break;
  case 0x14:
    pcStack_10 = "unterminated string";
    break;
  case 0x15:
    pcStack_10 = "expected object";
    break;
  case 0x16:
    pcStack_10 = "expected array";
    break;
  case 0x17:
    pcStack_10 = "expected literal or symbolic scalar";
    break;
  case 0x18:
    pcStack_10 = "expected union type";
    break;
  case 0x19:
    pcStack_10 = "union present with type NONE";
    break;
  case 0x1a:
    pcStack_10 = "union of type NONE is not null";
    break;
  case 0x1b:
    pcStack_10 = "table has incomplete union";
    break;
  case 0x1c:
    pcStack_10 = "table has duplicate field";
    break;
  case 0x1d:
    pcStack_10 = "required field missing";
    break;
  case 0x1e:
    pcStack_10 = "union vector length mismatch";
    break;
  case 0x1f:
    pcStack_10 = "invalid base64 content";
    break;
  case 0x20:
    pcStack_10 = "invalid base64url content";
    break;
  case 0x21:
    pcStack_10 = "fixed length array underflow";
    break;
  case 0x22:
    pcStack_10 = "fixed length array overflow";
    break;
  case 0x23:
    pcStack_10 = "runtime error";
    break;
  case 0x24:
    pcStack_10 = "not supported";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char *flatcc_json_parser_error_string(int err)
{
    switch (err) {
#define XX(no, str)                                                         \
    case flatcc_json_parser_error_##no:                                     \
        return str;
        FLATCC_JSON_PARSE_ERROR_MAP(XX)
#undef XX
    default:
        return "unknown";
    }
}